

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::DisposeObjects(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ConfigFlagsTable *pCVar4;
  undefined8 *in_FS_OFFSET;
  uint sweptBytes;
  bool local_81;
  undefined1 local_80 [8];
  AutoRestoreValue<bool> disableDispose;
  TrackAllocData oldAllocData;
  bool wasInAsync;
  SuspendRecord __suspendRecord;
  Recycler *this_local;
  
  if ((((this->allowDispose & 1U) == 0) || ((this->hasDisposableObject & 1U) == 0)) ||
     ((this->inDispose & 1U) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xd27,
                       "(this->allowDispose && this->hasDisposableObject && !this->inDispose)",
                       "this->allowDispose && this->hasDisposableObject && !this->inDispose");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if ((this->isHeapEnumInProgress & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xd28,"(!isHeapEnumInProgress)","!isHeapEnumInProgress");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  iVar3 = (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[0x10])();
  oldAllocData.line._3_1_ = (byte)iVar3 & 1;
  this->inDispose = true;
  memset(&disableDispose.oldValue,0,0x28);
  if (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0) {
    memcpy(&disableDispose.oldValue,&this->nextAllocData,0x28);
    TrackAllocData::Clear(&this->nextAllocData);
  }
  pCVar4 = GetRecyclerFlagsTable(this);
  bVar2 = Js::Phases::IsEnabled(&pCVar4->Trace,RecyclerPhase);
  if (bVar2) {
    Output::Print(L"Disposing objects\n");
  }
  local_81 = false;
  AutoRestoreValue<bool>::AutoRestoreValue
            ((AutoRestoreValue<bool> *)local_80,&this->allowDispose,&local_81);
  (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[0xf])();
  HeapInfoManager::DisposeObjects(&this->autoHeap);
  if (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0) {
    bVar2 = TrackAllocData::IsEmpty(&this->nextAllocData);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xd52,"(nextAllocData.IsEmpty())","nextAllocData.IsEmpty()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    memcpy(&this->nextAllocData,&disableDispose.oldValue,0x28);
  }
  if ((this->inDispose & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xd57,"(this->inDispose)","this->inDispose");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  this->inDispose = false;
  (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[0x11])
            (this->collectionWrapper,(ulong)(oldAllocData.line._3_1_ & 1),&oldAllocData.field_0x24);
  AutoRestoreValue<bool>::~AutoRestoreValue((AutoRestoreValue<bool> *)local_80);
  return;
}

Assistant:

void
Recycler::DisposeObjects()
{
    Assert(this->allowDispose && this->hasDisposableObject && !this->inDispose);
    Assert(!isHeapEnumInProgress);

    GCETW(GC_DISPOSE_START, (this));
    ASYNC_HOST_OPERATION_START(collectionWrapper);

    this->inDispose = true;

#ifdef PROFILE_RECYCLER_ALLOC
    // finalizer may allocate memory and dispose object can happen in the middle of allocation
    // save and restore the tracked object info
    TrackAllocData oldAllocData = { 0 };
    if (trackerDictionary != nullptr)
    {
        oldAllocData = nextAllocData;
        nextAllocData.Clear();
    }
#endif

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::RecyclerPhase))
    {
        Output::Print(_u("Disposing objects\n"));
    }
#endif

    // Disable dispose within this method, restore it when we're done
    AutoRestoreValue<bool> disableDispose(&this->allowDispose, false);

#ifdef FAULT_INJECTION
    this->collectionWrapper->DisposeScriptContextByFaultInjectionCallBack();
#endif
    this->collectionWrapper->PreDisposeObjectsCallBack();

    // Scope timestamp to just dispose
    {
        AUTO_TIMESTAMP(dispose);
        autoHeap.DisposeObjects();
    }

#ifdef PROFILE_RECYCLER_ALLOC
    if (trackerDictionary != nullptr)
    {
        Assert(nextAllocData.IsEmpty());
        nextAllocData = oldAllocData;
    }
#endif

    Assert(this->inDispose);

    this->inDispose = false;

    ASYNC_HOST_OPERATION_END(collectionWrapper);

    uint sweptBytes = 0;
#ifdef RECYCLER_STATS
    sweptBytes = (uint)collectionStats.objectSweptBytes;
#endif

    GCETW(GC_DISPOSE_STOP, (this, sweptBytes));
}